

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O1

QCborMap __thiscall QCborValue::toMap(QCborValue *this)

{
  int *piVar1;
  long *in_RSI;
  long in_FS_OFFSET;
  QCborMap local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QCborMap::QCborMap(&local_20);
  if ((int)in_RSI[2] == 0xa0) {
    piVar1 = (int *)in_RSI[1];
    if (piVar1 == (int *)0x0 || -1 < *in_RSI) {
      QCborMap::QCborMap((QCborMap *)this);
    }
    else {
      *(int **)this = piVar1;
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
  }
  else {
    QCborMap::QCborMap((QCborMap *)this,&local_20);
  }
  QCborMap::~QCborMap(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QCborMap QCborValue::toMap() const
{
    return toMap(QCborMap());
}